

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS
ref_subdiv_unmark_tet_opp_edge
          (REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell,REF_BOOL *again,REF_INT s0,
          REF_INT s1)

{
  uint e0;
  REF_INT e1;
  REF_BOOL *pRVar1;
  
  e0 = ref_subdiv_c2e(ref_subdiv,ref_cell,s0,cell);
  e1 = ref_subdiv_c2e(ref_subdiv,ref_cell,s1,cell);
  pRVar1 = ref_subdiv->mark;
  if ((pRVar1[(int)e0] != 0) && (pRVar1[e1] != 0)) {
    ref_subdiv_unmark_one_of_two(ref_subdiv,e0,e1);
    if (ref_subdiv->debug != 0) {
      printf("unmark tet opp proc %d cell %d sides %d %d edges %d %d\n",
             (ulong)(uint)ref_subdiv->grid->mpi->id,(ulong)(uint)cell,(ulong)(uint)s0,s1,(ulong)e0,
             e1);
    }
    *again = 1;
    pRVar1 = again;
  }
  return (REF_STATUS)pRVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_tet_opp_edge(
    REF_SUBDIV ref_subdiv, REF_CELL ref_cell, REF_INT cell, REF_BOOL *again,
    REF_INT s0, REF_INT s1) {
  REF_INT e0, e1;
  e0 = ref_subdiv_c2e(ref_subdiv, ref_cell, s0, cell);
  e1 = ref_subdiv_c2e(ref_subdiv, ref_cell, s1, cell);
  if (ref_subdiv_mark(ref_subdiv, e0) && ref_subdiv_mark(ref_subdiv, e1)) {
    ref_subdiv_unmark_one_of_two(ref_subdiv, e0, e1);
    if (ref_subdiv->debug)
      printf("unmark tet opp proc %d cell %d sides %d %d edges %d %d\n",
             ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)), cell, s0, s1, e0, e1);
    *again = REF_TRUE;
  }

  return REF_SUCCESS;
}